

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::~SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzer *this_local;
  
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0011ad50;
  Analyzer::KillThread();
  SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  std::vector<Channel,_std::allocator<Channel>_>::~vector(&this->mDataChannels);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            (&this->mDataNextEdge);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->mDataMasks);
  std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::~vector(&this->mData);
  std::auto_ptr<SimpleParallelAnalyzerResults>::~auto_ptr(&this->mResults);
  std::auto_ptr<SimpleParallelAnalyzerSettings>::~auto_ptr(&this->mSettings);
  Analyzer2::~Analyzer2(&this->super_Analyzer2);
  return;
}

Assistant:

SimpleParallelAnalyzer::~SimpleParallelAnalyzer()
{
	KillThread();
}